

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::anon_unknown_14::fulltext_log_assert_to_stream(ostream *s,AssertData *rb)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  ostream *poVar4;
  long in_RSI;
  ostream *in_RDI;
  String *in_stack_ffffffffffffff98;
  Enum code;
  ostream *in_stack_ffffffffffffffa0;
  char *local_50;
  char *local_38;
  
  if ((*(uint *)(in_RSI + 8) & 0x60) == 0) {
    poVar1 = Color::operator<<(in_stack_ffffffffffffffa0,
                               (Enum)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    pcVar2 = assertString(*(Enum *)(in_RSI + 8));
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1,"( ");
    poVar1 = std::operator<<(poVar1,*(char **)(in_RSI + 0x20));
    std::operator<<(poVar1," ) ");
    Color::operator<<(in_stack_ffffffffffffffa0,(Enum)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  }
  if ((*(uint *)(in_RSI + 8) & 0x10) == 0) {
    code = (Enum)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    if (((*(uint *)(in_RSI + 8) & 0x20) == 0) || ((*(uint *)(in_RSI + 8) & 0x40) == 0)) {
      if ((*(uint *)(in_RSI + 8) & 0x20) == 0) {
        if ((*(uint *)(in_RSI + 8) & 0x40) == 0) {
          if ((*(uint *)(in_RSI + 8) & 0x80) == 0) {
            if ((*(byte *)(in_RSI + 0x29) & 1) == 0) {
              pcVar2 = "is NOT correct!\n";
              if (((*(byte *)(in_RSI + 0x28) ^ 0xff) & 1) != 0) {
                pcVar2 = "is correct!\n";
              }
            }
            else {
              pcVar2 = "THREW exception: ";
            }
            std::operator<<(in_RDI,pcVar2);
            if ((*(byte *)(in_RSI + 0x29) & 1) == 0) {
              poVar1 = std::operator<<(in_RDI,"  values: ");
              pcVar3 = assertString(*(Enum *)(in_RSI + 8));
              poVar4 = std::operator<<(poVar1,pcVar3);
              std::operator<<(poVar4,"( ");
              poVar1 = doctest::operator<<((ostream *)pcVar2,(String *)poVar1);
              std::operator<<(poVar1," )\n");
            }
            else {
              poVar1 = doctest::operator<<((ostream *)pcVar2,in_stack_ffffffffffffff98);
              std::operator<<(poVar1,"\n");
            }
          }
          else {
            pcVar2 = "didn\'t throw!";
            if ((*(byte *)(in_RSI + 0x29) & 1) != 0) {
              pcVar2 = "THREW exception: ";
            }
            std::operator<<(in_RDI,pcVar2);
            Color::operator<<(in_stack_ffffffffffffffa0,
                              (Enum)((ulong)in_stack_ffffffffffffff98 >> 0x20));
            poVar1 = doctest::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
            std::operator<<(poVar1,"\n");
          }
        }
        else {
          poVar1 = Color::operator<<(in_stack_ffffffffffffffa0,code);
          pcVar2 = assertString(*(Enum *)(in_RSI + 8));
          poVar1 = std::operator<<(poVar1,pcVar2);
          poVar1 = std::operator<<(poVar1,"( ");
          poVar1 = std::operator<<(poVar1,*(char **)(in_RSI + 0x20));
          poVar1 = std::operator<<(poVar1,", \"");
          poVar1 = std::operator<<(poVar1,*(char **)(in_RSI + 0x70));
          std::operator<<(poVar1,"\" ) ");
          poVar1 = Color::operator<<(in_stack_ffffffffffffffa0,
                                     (Enum)((ulong)in_stack_ffffffffffffff98 >> 0x20));
          if ((*(byte *)(in_RSI + 0x29) & 1) == 0) {
            local_50 = "did NOT throw at all!";
          }
          else {
            local_50 = "threw a DIFFERENT exception: ";
            if (((*(byte *)(in_RSI + 0x28) ^ 0xff) & 1) != 0) {
              local_50 = "threw as expected!";
            }
          }
          std::operator<<(poVar1,local_50);
          Color::operator<<(in_stack_ffffffffffffffa0,
                            (Enum)((ulong)in_stack_ffffffffffffff98 >> 0x20));
          poVar1 = doctest::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          std::operator<<(poVar1,"\n");
        }
      }
      else {
        poVar1 = Color::operator<<(in_stack_ffffffffffffffa0,code);
        pcVar2 = assertString(*(Enum *)(in_RSI + 8));
        poVar1 = std::operator<<(poVar1,pcVar2);
        poVar1 = std::operator<<(poVar1,"( ");
        poVar1 = std::operator<<(poVar1,*(char **)(in_RSI + 0x20));
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = std::operator<<(poVar1,*(char **)(in_RSI + 0x68));
        std::operator<<(poVar1," ) ");
        poVar1 = Color::operator<<(in_stack_ffffffffffffffa0,
                                   (Enum)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        if ((*(byte *)(in_RSI + 0x29) & 1) == 0) {
          local_38 = "did NOT throw at all!";
        }
        else {
          local_38 = "threw a DIFFERENT exception: ";
          if ((*(byte *)(in_RSI + 0x60) & 1) != 0) {
            local_38 = "threw as expected!";
          }
        }
        std::operator<<(poVar1,local_38);
        Color::operator<<(in_stack_ffffffffffffffa0,(Enum)((ulong)in_stack_ffffffffffffff98 >> 0x20)
                         );
        poVar1 = doctest::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        std::operator<<(poVar1,"\n");
      }
    }
    else {
      poVar1 = Color::operator<<(in_stack_ffffffffffffffa0,code);
      pcVar2 = assertString(*(Enum *)(in_RSI + 8));
      poVar1 = std::operator<<(poVar1,pcVar2);
      poVar1 = std::operator<<(poVar1,"( ");
      poVar1 = std::operator<<(poVar1,*(char **)(in_RSI + 0x20));
      poVar1 = std::operator<<(poVar1,", \"");
      poVar1 = std::operator<<(poVar1,*(char **)(in_RSI + 0x70));
      poVar1 = std::operator<<(poVar1,"\", ");
      poVar1 = std::operator<<(poVar1,*(char **)(in_RSI + 0x68));
      std::operator<<(poVar1," ) ");
      Color::operator<<(in_stack_ffffffffffffffa0,(Enum)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      if ((*(byte *)(in_RSI + 0x29) & 1) == 0) {
        std::operator<<(in_RDI,"did NOT throw at all!\n");
      }
      else if ((*(byte *)(in_RSI + 0x28) & 1) == 0) {
        std::operator<<(in_RDI,"threw as expected!\n");
      }
      else {
        std::operator<<(in_RDI,"threw a DIFFERENT exception! (contents: ");
        poVar1 = doctest::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        std::operator<<(poVar1,")\n");
      }
    }
  }
  else {
    pcVar2 = "did NOT throw at all!";
    if ((*(byte *)(in_RSI + 0x29) & 1) != 0) {
      pcVar2 = "threw as expected!";
    }
    poVar1 = std::operator<<(in_RDI,pcVar2);
    std::operator<<(poVar1,"\n");
  }
  return;
}

Assistant:

void fulltext_log_assert_to_stream(std::ostream& s, const AssertData& rb) {
        if((rb.m_at & (assertType::is_throws_as | assertType::is_throws_with)) ==
            0) //!OCLINT bitwise operator in conditional
            s << Color::Cyan << assertString(rb.m_at) << "( " << rb.m_expr << " ) "
                << Color::None;

        if(rb.m_at & assertType::is_throws) { //!OCLINT bitwise operator in conditional
            s << (rb.m_threw ? "threw as expected!" : "did NOT throw at all!") << "\n";
        } else if((rb.m_at & assertType::is_throws_as) &&
                    (rb.m_at & assertType::is_throws_with)) { //!OCLINT
            s << Color::Cyan << assertString(rb.m_at) << "( " << rb.m_expr << ", \""
                << rb.m_exception_string << "\", " << rb.m_exception_type << " ) " << Color::None;
            if(rb.m_threw) {
                if(!rb.m_failed) {
                    s << "threw as expected!\n";
                } else {
                    s << "threw a DIFFERENT exception! (contents: " << rb.m_exception << ")\n";
                }
            } else {
                s << "did NOT throw at all!\n";
            }
        } else if(rb.m_at &
                    assertType::is_throws_as) { //!OCLINT bitwise operator in conditional
            s << Color::Cyan << assertString(rb.m_at) << "( " << rb.m_expr << ", "
                << rb.m_exception_type << " ) " << Color::None
                << (rb.m_threw ? (rb.m_threw_as ? "threw as expected!" :
                                                "threw a DIFFERENT exception: ") :
                                "did NOT throw at all!")
                << Color::Cyan << rb.m_exception << "\n";
        } else if(rb.m_at &
                    assertType::is_throws_with) { //!OCLINT bitwise operator in conditional
            s << Color::Cyan << assertString(rb.m_at) << "( " << rb.m_expr << ", \""
                << rb.m_exception_string << "\" ) " << Color::None
                << (rb.m_threw ? (!rb.m_failed ? "threw as expected!" :
                                                "threw a DIFFERENT exception: ") :
                                "did NOT throw at all!")
                << Color::Cyan << rb.m_exception << "\n";
        } else if(rb.m_at & assertType::is_nothrow) { //!OCLINT bitwise operator in conditional
            s << (rb.m_threw ? "THREW exception: " : "didn't throw!") << Color::Cyan
                << rb.m_exception << "\n";
        } else {
            s << (rb.m_threw ? "THREW exception: " :
                                (!rb.m_failed ? "is correct!\n" : "is NOT correct!\n"));
            if(rb.m_threw)
                s << rb.m_exception << "\n";
            else
                s << "  values: " << assertString(rb.m_at) << "( " << rb.m_decomp << " )\n";
        }
    }